

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *file_pin;
  int option_index;
  undefined4 local_44;
  char *local_40;
  char *local_38;
  
  local_44 = 0;
  if (argc != 1) {
    local_38 = (char *)0x0;
    local_40 = (char *)0x0;
    file_pin = (char *)0x0;
    do {
      iVar1 = getopt_long(argc,argv,"hv",long_options,&local_44);
      switch(iVar1) {
      case 0x101:
        local_40 = _optarg;
        break;
      case 0x102:
        local_38 = _optarg;
        break;
      case 0x103:
        file_pin = _optarg;
        break;
      case 0x104:
        goto switchD_00102558_caseD_104;
      default:
        if (iVar1 == -1) {
          iVar1 = to_pkcs8(local_40,local_38,file_pin);
          return iVar1;
        }
        if (iVar1 != 0x76) goto LAB_001025c1;
        goto switchD_00102558_caseD_104;
      }
    } while( true );
  }
LAB_001025c1:
  usage();
LAB_001025c6:
  exit(0);
switchD_00102558_caseD_104:
  puts("2.6.1");
  goto LAB_001025c6;
}

Assistant:

int main(int argc, char* argv[])
{
	int option_index = 0;
	int opt, result;

	char* in_path = NULL;
	char* out_path = NULL;
	char* file_pin = NULL;

	if (argc == 1)
	{
		usage();
		exit(0);
	}

	while ((opt = getopt_long(argc, argv, "hv", long_options, &option_index)) != -1)
	{
		switch (opt)
		{
			case OPT_IN:
				in_path = optarg;
				break;
			case OPT_OUT:
				out_path = optarg;
				break;
			case OPT_PIN:
				file_pin = optarg;
				break;
			case OPT_VERSION:
			case 'v':
				printf("%s\n", PACKAGE_VERSION);
				exit(0);
				break;
			case OPT_HELP:
			case 'h':
			default:
				usage();
				exit(0);
				break;
		}
	}

	// We should convert to PKCS#8
	result = to_pkcs8(in_path, out_path, file_pin);

	return result;
}